

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMaterialSurfaceNSC.cpp
# Opt level: O1

void __thiscall
chrono::ChMaterialCompositeNSC::ChMaterialCompositeNSC
          (ChMaterialCompositeNSC *this,ChMaterialCompositionStrategy *strategy,
          shared_ptr<chrono::ChMaterialSurfaceNSC> *mat1,
          shared_ptr<chrono::ChMaterialSurfaceNSC> *mat2)

{
  float fVar1;
  
  (this->super_ChMaterialComposite)._vptr_ChMaterialComposite =
       (_func_int **)&PTR__ChMaterialComposite_00b3d770;
  fVar1 = (((mat1->super___shared_ptr<chrono::ChMaterialSurfaceNSC,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr)->super_ChMaterialSurface).static_friction;
  (*strategy->_vptr_ChMaterialCompositionStrategy[2])
            ((ulong)(uint)fVar1,
             (ulong)(uint)(((mat2->
                            super___shared_ptr<chrono::ChMaterialSurfaceNSC,_(__gnu_cxx::_Lock_policy)2>
                            )._M_ptr)->super_ChMaterialSurface).static_friction,strategy);
  this->static_friction = fVar1;
  fVar1 = (((mat1->super___shared_ptr<chrono::ChMaterialSurfaceNSC,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr)->super_ChMaterialSurface).sliding_friction;
  (*strategy->_vptr_ChMaterialCompositionStrategy[2])
            ((ulong)(uint)fVar1,
             (ulong)(uint)(((mat2->
                            super___shared_ptr<chrono::ChMaterialSurfaceNSC,_(__gnu_cxx::_Lock_policy)2>
                            )._M_ptr)->super_ChMaterialSurface).sliding_friction,strategy);
  this->sliding_friction = fVar1;
  fVar1 = (((mat1->super___shared_ptr<chrono::ChMaterialSurfaceNSC,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr)->super_ChMaterialSurface).restitution;
  (*strategy->_vptr_ChMaterialCompositionStrategy[4])
            ((ulong)(uint)fVar1,
             (ulong)(uint)(((mat2->
                            super___shared_ptr<chrono::ChMaterialSurfaceNSC,_(__gnu_cxx::_Lock_policy)2>
                            )._M_ptr)->super_ChMaterialSurface).restitution,strategy);
  this->restitution = fVar1;
  fVar1 = *(float *)&(((mat1->
                       super___shared_ptr<chrono::ChMaterialSurfaceNSC,_(__gnu_cxx::_Lock_policy)2>)
                      ._M_ptr)->super_ChMaterialSurface).field_0x1c;
  (*strategy->_vptr_ChMaterialCompositionStrategy[3])
            ((ulong)(uint)fVar1,
             (ulong)*(uint *)&(((mat2->
                                super___shared_ptr<chrono::ChMaterialSurfaceNSC,_(__gnu_cxx::_Lock_policy)2>
                                )._M_ptr)->super_ChMaterialSurface).field_0x1c,strategy);
  this->cohesion = fVar1;
  fVar1 = ((mat1->super___shared_ptr<chrono::ChMaterialSurfaceNSC,_(__gnu_cxx::_Lock_policy)2>).
          _M_ptr)->dampingf;
  (*strategy->_vptr_ChMaterialCompositionStrategy[5])
            ((ulong)(uint)fVar1,
             (ulong)(uint)((mat2->
                           super___shared_ptr<chrono::ChMaterialSurfaceNSC,_(__gnu_cxx::_Lock_policy)2>
                           )._M_ptr)->dampingf,strategy);
  this->dampingf = fVar1;
  fVar1 = ((mat1->super___shared_ptr<chrono::ChMaterialSurfaceNSC,_(__gnu_cxx::_Lock_policy)2>).
          _M_ptr)->compliance;
  (*strategy->_vptr_ChMaterialCompositionStrategy[6])
            ((ulong)(uint)fVar1,
             (ulong)(uint)((mat2->
                           super___shared_ptr<chrono::ChMaterialSurfaceNSC,_(__gnu_cxx::_Lock_policy)2>
                           )._M_ptr)->compliance,strategy);
  this->compliance = fVar1;
  fVar1 = ((mat1->super___shared_ptr<chrono::ChMaterialSurfaceNSC,_(__gnu_cxx::_Lock_policy)2>).
          _M_ptr)->complianceT;
  (*strategy->_vptr_ChMaterialCompositionStrategy[6])
            ((ulong)(uint)fVar1,
             (ulong)(uint)((mat2->
                           super___shared_ptr<chrono::ChMaterialSurfaceNSC,_(__gnu_cxx::_Lock_policy)2>
                           )._M_ptr)->complianceT,strategy);
  this->complianceT = fVar1;
  fVar1 = (((mat1->super___shared_ptr<chrono::ChMaterialSurfaceNSC,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr)->super_ChMaterialSurface).rolling_friction;
  (*strategy->_vptr_ChMaterialCompositionStrategy[2])
            ((ulong)(uint)fVar1,
             (ulong)(uint)(((mat2->
                            super___shared_ptr<chrono::ChMaterialSurfaceNSC,_(__gnu_cxx::_Lock_policy)2>
                            )._M_ptr)->super_ChMaterialSurface).rolling_friction,strategy);
  this->rolling_friction = fVar1;
  fVar1 = (((mat1->super___shared_ptr<chrono::ChMaterialSurfaceNSC,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr)->super_ChMaterialSurface).spinning_friction;
  (*strategy->_vptr_ChMaterialCompositionStrategy[2])
            ((ulong)(uint)fVar1,
             (ulong)(uint)(((mat2->
                            super___shared_ptr<chrono::ChMaterialSurfaceNSC,_(__gnu_cxx::_Lock_policy)2>
                            )._M_ptr)->super_ChMaterialSurface).spinning_friction,strategy);
  this->spinning_friction = fVar1;
  fVar1 = ((mat1->super___shared_ptr<chrono::ChMaterialSurfaceNSC,_(__gnu_cxx::_Lock_policy)2>).
          _M_ptr)->complianceRoll;
  (*strategy->_vptr_ChMaterialCompositionStrategy[6])
            ((ulong)(uint)fVar1,
             (ulong)(uint)((mat2->
                           super___shared_ptr<chrono::ChMaterialSurfaceNSC,_(__gnu_cxx::_Lock_policy)2>
                           )._M_ptr)->complianceRoll,strategy);
  this->complianceRoll = fVar1;
  fVar1 = ((mat1->super___shared_ptr<chrono::ChMaterialSurfaceNSC,_(__gnu_cxx::_Lock_policy)2>).
          _M_ptr)->complianceSpin;
  (*strategy->_vptr_ChMaterialCompositionStrategy[6])
            ((ulong)(uint)fVar1,
             (ulong)(uint)((mat2->
                           super___shared_ptr<chrono::ChMaterialSurfaceNSC,_(__gnu_cxx::_Lock_policy)2>
                           )._M_ptr)->complianceSpin,strategy);
  this->complianceSpin = fVar1;
  return;
}

Assistant:

ChMaterialCompositeNSC::ChMaterialCompositeNSC(ChMaterialCompositionStrategy* strategy,
                                               std::shared_ptr<ChMaterialSurfaceNSC> mat1,
                                               std::shared_ptr<ChMaterialSurfaceNSC> mat2) {
    static_friction = strategy->CombineFriction(mat1->static_friction, mat2->static_friction);
    sliding_friction = strategy->CombineFriction(mat1->sliding_friction, mat2->sliding_friction);
    restitution = strategy->CombineRestitution(mat1->restitution, mat2->restitution);
    cohesion = strategy->CombineCohesion(mat1->cohesion, mat2->cohesion);
    dampingf = strategy->CombineDamping(mat1->dampingf, mat2->dampingf);
    compliance = strategy->CombineCompliance(mat1->compliance, mat2->compliance);
    complianceT = strategy->CombineCompliance(mat1->complianceT, mat2->complianceT);

    rolling_friction = strategy->CombineFriction(mat1->rolling_friction, mat2->rolling_friction);
    spinning_friction = strategy->CombineFriction(mat1->spinning_friction, mat2->spinning_friction);
    complianceRoll = strategy->CombineCompliance(mat1->complianceRoll , mat2->complianceRoll);
    complianceSpin = strategy->CombineCompliance(mat1->complianceSpin , mat2->complianceSpin);
}